

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::debugging_internal::MaybeAppend(State *state,char *str)

{
  char *str_00;
  State *in_RSI;
  long in_RDI;
  size_t length;
  
  if (*(int *)(in_RDI + 0x28) < 0) {
    str_00 = (char *)StrLen((char *)in_RSI);
    MaybeAppendWithLength(in_RSI,str_00,0x3d2ddf);
  }
  return true;
}

Assistant:

static bool MaybeAppend(State *state, const char *const str) {
  if (state->parse_state.append) {
    size_t length = StrLen(str);
    MaybeAppendWithLength(state, str, length);
  }
  return true;
}